

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O1

void __thiscall helics::apps::Clone::runTo(Clone *this,Time runToTime)

{
  long lVar1;
  element_type *peVar2;
  Time currentTime;
  ostream *poVar3;
  int iteration;
  long lVar4;
  iteration_time iVar5;
  
  (*(this->super_App)._vptr_App[2])();
  lVar1 = (this->nextPrintTimeStep).internalTimeCode;
  lVar4 = 0x7fffffffffffffff;
  if (0 < lVar1) {
    lVar4 = lVar1;
  }
  iteration = 0;
  do {
    if (this->allow_iteration == true) {
      peVar2 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = Federate::requestTimeIterative
                        ((Federate *)
                         ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                         (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),runToTime,
                         ITERATE_IF_NEEDED);
      currentTime = iVar5.grantedTime.internalTimeCode;
      if (iVar5.state == NEXT_STEP) {
        iteration = 0;
      }
      captureForCurrentTime(this,currentTime,iteration);
      iteration = iteration + 1;
    }
    else {
      peVar2 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      currentTime = Federate::requestTime
                              ((Federate *)
                               ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                               (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),
                               runToTime);
      captureForCurrentTime(this,currentTime,0);
    }
    if (((currentTime.internalTimeCode < runToTime.internalTimeCode) &&
        (lVar4 <= currentTime.internalTimeCode)) && (0 < (this->nextPrintTimeStep).internalTimeCode)
       ) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"processed for time ",0x13);
      poVar3 = std::ostream::_M_insert<double>
                         ((double)(currentTime.internalTimeCode % 1000000000) * 1e-09 +
                          (double)(currentTime.internalTimeCode / 1000000000));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      lVar4 = lVar4 + (this->nextPrintTimeStep).internalTimeCode;
    }
  } while (currentTime.internalTimeCode < runToTime.internalTimeCode);
  return;
}

Assistant:

void Clone::runTo(Time runToTime)
{
    initialize();

    Time nextPrintTime = (nextPrintTimeStep > timeZero) ? nextPrintTimeStep : Time::maxVal();
    try {
        int iteration = 0;
        while (true) {
            helics::Time grantedTime;
            if (allow_iteration) {
                auto ItRes =
                    fed->requestTimeIterative(runToTime, IterationRequest::ITERATE_IF_NEEDED);
                if (ItRes.state == IterationResult::NEXT_STEP) {
                    iteration = 0;
                }
                grantedTime = ItRes.grantedTime;
                captureForCurrentTime(grantedTime, iteration);
                ++iteration;
            } else {
                grantedTime = fed->requestTime(runToTime);
                captureForCurrentTime(grantedTime);
            }

            if (grantedTime >= runToTime) {
                break;
            }
            if ((grantedTime >= nextPrintTime) && (nextPrintTimeStep > timeZero)) {
                std::cout << "processed for time " << static_cast<double>(grantedTime) << "\n";
                nextPrintTime += nextPrintTimeStep;
            }
        }
    }
    catch (...) {
        std::cerr << "error generate on run\n";
    }
}